

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::Block::Block(Block *this)

{
  Block *this_local;
  
  std::__cxx11::string::string((string *)this);
  FuncDeclaration::FuncDeclaration(&this->decl);
  intrusive_list<wabt::Expr>::intrusive_list(&this->exprs);
  Location::Location(&this->end_loc);
  return;
}

Assistant:

Block() = default;